

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

int ptls_openssl_decrypt_ticket
              (ptls_buffer_t *buf,ptls_iovec_t src,
              _func_int_uchar_ptr_uchar_ptr_EVP_CIPHER_CTX_ptr_HMAC_CTX_ptr_int *cb)

{
  ptls_buffer_t *ppVar1;
  int iVar2;
  int iVar3;
  EVP_CIPHER_CTX *a;
  HMAC_CTX *ctx;
  size_t sVar4;
  ulong uVar5;
  uchar *data;
  size_t len;
  int clen;
  uint8_t hmac [64];
  int local_84;
  ptls_buffer_t *local_80;
  uchar local_78 [72];
  
  uVar5 = src.len;
  data = src.base;
  a = EVP_CIPHER_CTX_new();
  if (a == (EVP_CIPHER_CTX *)0x0) {
    return 0x201;
  }
  local_80 = buf;
  ctx = (HMAC_CTX *)HMAC_CTX_new();
  if (ctx == (HMAC_CTX *)0x0) {
    EVP_CIPHER_CTX_free(a);
    return 0x201;
  }
  iVar3 = 0x32;
  if (uVar5 < 0x20) goto LAB_0010c151;
  iVar2 = (*cb)(data,data + 0x10,(EVP_CIPHER_CTX *)a,(HMAC_CTX *)ctx,0);
  if (iVar2 != 0) {
    sVar4 = HMAC_size(ctx);
    if (uVar5 < sVar4 + 0x20) goto LAB_0010c151;
    len = uVar5 - sVar4;
    iVar3 = HMAC_Update(ctx,data,len);
    if ((iVar3 != 0) && (iVar3 = HMAC_Final(ctx,local_78,(uint *)0x0), iVar3 != 0)) {
      iVar3 = (*ptls_mem_equal)(data + len,local_78,sVar4);
      if (iVar3 == 0) {
        iVar3 = 0x28;
        goto LAB_0010c151;
      }
      iVar3 = ptls_buffer_reserve(local_80,len - 0x20);
      ppVar1 = local_80;
      if (iVar3 != 0) goto LAB_0010c151;
      iVar3 = EVP_DecryptUpdate(a,local_80->base + local_80->off,&local_84,data + 0x20,
                                (int)(len - 0x20));
      if (iVar3 != 0) {
        sVar4 = (long)local_84 + ppVar1->off;
        ppVar1->off = sVar4;
        iVar2 = EVP_DecryptFinal_ex(a,ppVar1->base + sVar4,&local_84);
        iVar3 = 0x203;
        if (iVar2 != 0) {
          local_80->off = local_80->off + (long)local_84;
          iVar3 = 0;
        }
        goto LAB_0010c151;
      }
    }
  }
  iVar3 = 0x203;
LAB_0010c151:
  EVP_CIPHER_CTX_free(a);
  HMAC_CTX_free(ctx);
  return iVar3;
}

Assistant:

int ptls_openssl_decrypt_ticket(ptls_buffer_t *buf, ptls_iovec_t src,
                                int (*cb)(unsigned char *key_name, unsigned char *iv, EVP_CIPHER_CTX *ctx, HMAC_CTX *hctx, int enc))
{
    EVP_CIPHER_CTX *cctx = NULL;
    HMAC_CTX *hctx = NULL;
    int clen, ret;

    if ((cctx = EVP_CIPHER_CTX_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if ((hctx = HMAC_CTX_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    /* obtain cipher and hash context.
     * Note: no need to handle renew, since in picotls we always send a new ticket to minimize the chance of ticket reuse */
    if (src.len < TICKET_LABEL_SIZE + TICKET_IV_SIZE) {
        ret = PTLS_ALERT_DECODE_ERROR;
        goto Exit;
    }
    if (!(*cb)(src.base, src.base + TICKET_LABEL_SIZE, cctx, hctx, 0)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }

    /* check hmac, and exclude label, iv, hmac */
    size_t hmac_size = HMAC_size(hctx);
    if (src.len < TICKET_LABEL_SIZE + TICKET_IV_SIZE + hmac_size) {
        ret = PTLS_ALERT_DECODE_ERROR;
        goto Exit;
    }
    src.len -= hmac_size;
    uint8_t hmac[EVP_MAX_MD_SIZE];
    if (!HMAC_Update(hctx, src.base, src.len) || !HMAC_Final(hctx, hmac, NULL)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if (!ptls_mem_equal(src.base + src.len, hmac, hmac_size)) {
        ret = PTLS_ALERT_HANDSHAKE_FAILURE;
        goto Exit;
    }
    src.base += TICKET_LABEL_SIZE + TICKET_IV_SIZE;
    src.len -= TICKET_LABEL_SIZE + TICKET_IV_SIZE;

    /* decrypt */
    if ((ret = ptls_buffer_reserve(buf, src.len)) != 0)
        goto Exit;
    if (!EVP_DecryptUpdate(cctx, buf->base + buf->off, &clen, src.base, (int)src.len)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    buf->off += clen;
    if (!EVP_DecryptFinal_ex(cctx, buf->base + buf->off, &clen)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    buf->off += clen;

    ret = 0;

Exit:
    if (cctx != NULL)
        EVP_CIPHER_CTX_free(cctx);
    if (hctx != NULL)
        HMAC_CTX_free(hctx);
    return ret;
}